

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O3

RegressionLine *
ZXing::QRCode::TraceLine
          (RegressionLine *__return_storage_ptr__,BitMatrix *image,PointF p,PointF d,int edge)

{
  Direction dir;
  bool bVar1;
  Value VVar2;
  undefined7 extraout_var;
  PointT<int> d_00;
  uint uVar3;
  PointT<int> d_01;
  PointT<int> d_02;
  PointT<int> PVar4;
  PointT<int> d_03;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  PointF PVar13;
  double dVar14;
  BitMatrixCursorI c;
  BitMatrixCursor<ZXing::PointT<int>_> local_b8;
  undefined8 local_a0;
  BitMatrixCursor<ZXing::PointT<int>_> local_98;
  BitMatrixCursor<ZXing::PointT<double>_> local_80;
  PointT<double> local_58;
  PointF local_48;
  undefined1 auVar9 [16];
  
  local_80.p.y = p.y;
  local_80.p.x = p.x;
  auVar11._0_8_ = d.x - local_80.p.x;
  auVar11._8_8_ = d.y - local_80.p.y;
  dVar8 = ABS(auVar11._8_8_);
  if (ABS(auVar11._8_8_) <= ABS(auVar11._0_8_)) {
    dVar8 = ABS(auVar11._0_8_);
  }
  auVar9._8_8_ = dVar8;
  auVar9._0_8_ = dVar8;
  local_80.d = (PointT<double>)divpd(auVar11,auVar9);
  local_80.img = image;
  local_58 = local_80.d;
  local_48 = p;
  RegressionLine::RegressionLine(__return_storage_ptr__);
  auVar6._0_8_ = SQRT(local_58.x * local_58.x + local_58.y * local_58.y);
  auVar12._0_8_ = -local_58.x;
  auVar12._8_8_ = -local_58.y;
  auVar6._8_8_ = auVar6._0_8_;
  PVar13 = (PointF)divpd(auVar12,auVar6);
  __return_storage_ptr__->_directionInward = PVar13;
  BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&local_80,edge,0,edge == 3);
  dVar8 = local_80.d.x;
  dVar7 = local_80.d.y;
  if (edge == 3) {
    dVar8 = -local_80.d.x;
    dVar7 = -local_80.d.y;
    local_80.d.y = dVar7;
    local_80.d.x = dVar8;
  }
  dVar14 = ABS(dVar8);
  if (dVar14 <= ABS(dVar7)) {
    dVar8 = 0.0;
  }
  local_b8.p.x = (int)local_80.p.x;
  iVar10 = (int)(double)(~-(ulong)(ABS(dVar7) < dVar14) & (ulong)dVar7);
  local_b8.p.y = (int)local_80.p.y;
  local_a0 = CONCAT44(iVar10,(int)dVar8);
  d_01.x = -(int)dVar8;
  d_01.y = -iVar10;
  local_b8.img = image;
  VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_01);
  while (VVar2.v == -1) {
    d_02.y = -local_b8.d.x;
    d_02.x = local_b8.d.y;
    VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_02);
    PVar4.y = 0;
    PVar4.x = -local_b8.d.y;
    d_00.y = local_b8.d.x;
    d_00.x = -local_b8.d.y;
    uVar3 = local_b8.d.x;
    if (VVar2.v == -1) {
      VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_00);
      if (VVar2.v == -1) {
        iVar10 = local_b8.p.y;
        local_b8.p.x = local_b8.p.x - local_b8.d.x;
        local_b8.p.y = iVar10 - local_b8.d.y;
        PVar4 = local_b8.d;
        uVar3 = local_b8.d.y;
        d_00 = local_b8.d;
      }
      else {
        PVar4.y = 0;
        PVar4.x = local_b8.d.y;
        d_00.y = -local_b8.d.x;
        d_00.x = local_b8.d.y;
        uVar3 = -local_b8.d.x;
      }
    }
    local_b8.d = d_00;
    d_03.x = -PVar4.x;
    d_03.y = -uVar3;
    VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_03);
  }
  local_a0 = 0x1ffffffff;
  lVar5 = 0;
  do {
    dir = *(Direction *)((long)&local_a0 + lVar5);
    local_98.d.x = -(local_b8.d.y * dir);
    local_98.d.y = local_b8.d.x * dir;
    local_98.p = local_b8.p;
    dVar8 = ABS(local_80.p.y - local_48.y);
    if (ABS(local_80.p.y - local_48.y) <= ABS(local_80.p.x - local_48.x)) {
      dVar8 = ABS(local_80.p.x - local_48.x);
    }
    iVar10 = (int)dVar8 + 1;
    local_98.img = image;
    do {
      PVar13.x = (double)local_98.p.x + 0.5;
      PVar13.y = (double)local_98.p.y + 0.5;
      RegressionLine::add(__return_storage_ptr__,PVar13);
      iVar10 = iVar10 + -1;
      if (iVar10 < 2) break;
      bVar1 = BitMatrixCursor<ZXing::PointT<int>_>::stepAlongEdge(&local_98,dir,true);
    } while (bVar1);
    lVar5 = lVar5 + 4;
    if (lVar5 == 8) {
      bVar1 = RegressionLine::evaluate(__return_storage_ptr__,1.0,true);
      return (RegressionLine *)CONCAT71(extraout_var,bVar1);
    }
  } while( true );
}

Assistant:

static RegressionLine TraceLine(const BitMatrix& image, PointF p, PointF d, int edge)
{
	BitMatrixCursorF cur(image, p, d - p);
	RegressionLine line;
	line.setDirectionInward(cur.back());

	// collect points inside the black line -> backup on 3rd edge
	cur.stepToEdge(edge, 0, edge == 3);
	if (edge == 3)
		cur.turnBack();

	auto curI = BitMatrixCursorI(image, PointI(cur.p), PointI(mainDirection(cur.d)));
	// make sure curI positioned such that the white->black edge is directly behind
	// Test image: fix-traceline.jpg
	while (!curI.edgeAtBack()) {
		if (curI.edgeAtLeft())
			curI.turnRight();
		else if (curI.edgeAtRight())
			curI.turnLeft();
		else
			curI.step(-1);
	}

	for (auto dir : {Direction::LEFT, Direction::RIGHT}) {
		auto c = BitMatrixCursorI(image, curI.p, curI.direction(dir));
		auto stepCount = static_cast<int>(maxAbsComponent(cur.p - p));
		do {
			line.add(centered(c.p));
		} while (--stepCount > 0 && c.stepAlongEdge(dir, true));
	}

	line.evaluate(1.0, true);

	for (auto p : line.points())
		log(p, 2);

	return line;
}